

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

int Cba_NtkPrepareBits(Cba_Ntk_t *p)

{
  int iVar1;
  int local_18;
  int local_14;
  int nBits;
  int i;
  Cba_Ntk_t *p_local;
  
  local_18 = 0;
  Cba_NtkCleanFonCopies(p);
  local_14 = 1;
  while( true ) {
    iVar1 = Vec_IntSize(&p->vFonObj);
    if (iVar1 <= local_14) break;
    Cba_FonSetCopy(p,local_14,local_18);
    iVar1 = Cba_FonRangeSize(p,local_14);
    local_18 = iVar1 + local_18;
    local_14 = local_14 + 1;
  }
  return local_18;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Helper functions.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cba_NtkPrepareBits( Cba_Ntk_t * p )
{
    int i, nBits = 0;
    Cba_NtkCleanFonCopies( p );
    Cba_NtkForEachFon( p, i )
    {
        Cba_FonSetCopy( p, i, nBits );
        nBits += Cba_FonRangeSize( p, i );
    }
    return nBits;
}